

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.cpp
# Opt level: O0

CharTypes Js::CharClassifier::GetBigCharTypeES5(codepoint_t codepoint,CharClassifier *instance)

{
  CharacterClassificationType CVar1;
  CharacterClassificationType charType;
  CharClassifier *instance_local;
  codepoint_t codepoint_local;
  
  if (codepoint < 0x10000) {
    if ((codepoint == 0x2028) || (codepoint == 0x2029)) {
      instance_local._4_4_ = _C_NWL;
    }
    else {
      CVar1 = PlatformAgnostic::UnicodeText::GetLegacyCharacterClassificationType((char16)codepoint)
      ;
      if (CVar1 == Letter) {
        instance_local._4_4_ = _C_LET;
      }
      else if (CVar1 == Whitespace) {
        instance_local._4_4_ = _C_WSP;
      }
      else {
        instance_local._4_4_ = _C_ERR;
      }
    }
  }
  else {
    instance_local._4_4_ = _C_ERR;
  }
  return instance_local._4_4_;
}

Assistant:

CharTypes Js::CharClassifier::GetBigCharTypeES5(codepoint_t codepoint, const Js::CharClassifier *instance)
{
    using namespace PlatformAgnostic::UnicodeText;

    if (codepoint > 0xFFFF)
    {
        return CharTypes::_C_ERR;
    }

    if (codepoint == kchLS || codepoint == kchPS)
    {
        return _C_NWL;
    }

    auto charType = GetLegacyCharacterClassificationType((char16)codepoint);
    if (charType == CharacterClassificationType::Letter)
    {
        return CharTypes::_C_LET;
    }
    else if (charType == CharacterClassificationType::Whitespace)
    {
        return CharTypes::_C_WSP;
    }

    return CharTypes::_C_ERR;
}